

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinFoodWeb_kry.c
# Opt level: O3

int func(N_Vector cc,N_Vector fval,void *user_data)

{
  long lVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  
  dVar3 = *(double *)((long)user_data + 0x438);
  dVar4 = *(double *)((long)user_data + 0x440);
  lVar14 = 0;
  lVar11 = 0;
  do {
    lVar1 = lVar11 + 0x180;
    lVar17 = lVar1;
    if (lVar14 == 7) {
      lVar17 = lVar11 + -0x180;
    }
    lVar16 = lVar11 + -0x180;
    if (lVar14 == 0) {
      lVar16 = lVar1;
    }
    lVar18 = 0;
    do {
      lVar6 = *(long *)((long)cc->content + 0x10);
      lVar2 = lVar14 * 0x30 + lVar18 * 6;
      lVar7 = *(long *)(**(long **)((long)user_data + 0x410) + 0x10);
      lVar8 = *(long *)((long)fval->content + 0x10);
      WebRate((double)lVar18 * dVar3,(double)lVar14 * dVar4,(realtype *)(lVar6 + lVar2 * 8),
              (realtype *)(lVar7 + lVar2 * 8),user_data);
      lVar2 = lVar11 + 0x30;
      lVar13 = lVar2;
      if (lVar18 == 7) {
        lVar13 = lVar11 + -0x30;
      }
      lVar9 = *(long *)((long)user_data + 0x418);
      lVar10 = *(long *)((long)user_data + 0x420);
      lVar12 = lVar11 + -0x30;
      if (lVar18 == 0) {
        lVar12 = lVar2;
      }
      lVar15 = 0;
      do {
        dVar5 = *(double *)(lVar6 + lVar11 + lVar15);
        *(double *)(lVar8 + lVar11 + lVar15) =
             ((*(double *)(lVar6 + lVar17 + lVar15) - dVar5) -
             (dVar5 - *(double *)(lVar6 + lVar16 + lVar15))) * *(double *)(lVar10 + lVar15) +
             ((*(double *)(lVar13 + lVar6 + lVar15) - dVar5) -
             (dVar5 - *(double *)(lVar12 + lVar6 + lVar15))) * *(double *)(lVar9 + lVar15) +
             *(double *)(lVar7 + lVar11 + lVar15);
        lVar15 = lVar15 + 8;
      } while (lVar15 != 0x30);
      lVar18 = lVar18 + 1;
      lVar17 = lVar17 + 0x30;
      lVar16 = lVar16 + 0x30;
      lVar11 = lVar2;
    } while (lVar18 != 8);
    lVar14 = lVar14 + 1;
    lVar11 = lVar1;
  } while (lVar14 != 8);
  return 0;
}

Assistant:

static int func(N_Vector cc, N_Vector fval, void *user_data)
{
  realtype xx, yy, delx, dely, *cxy, *rxy, *fxy, dcyli, dcyui, dcxli, dcxri;
  sunindextype jx, jy, is, idyu, idyl, idxr, idxl;
  UserData data;
  
  data = (UserData)user_data;
  delx = data->dx;
  dely = data->dy;
  
  /* Loop over all mesh points, evaluating rate array at each point*/
  for (jy = 0; jy < MY; jy++) {
    
    yy = dely*jy;

    /* Set lower/upper index shifts, special at boundaries. */
    idyl = (jy != 0   ) ? NSMX : -NSMX;
    idyu = (jy != MY-1) ? NSMX : -NSMX;
    
    for (jx = 0; jx < MX; jx++) {

      xx = delx*jx;

      /* Set left/right index shifts, special at boundaries. */
      idxl = (jx !=  0  ) ?  NUM_SPECIES : -NUM_SPECIES;
      idxr = (jx != MX-1) ?  NUM_SPECIES : -NUM_SPECIES;

      cxy = IJ_Vptr(cc,jx,jy);
      rxy = IJ_Vptr(data->rates,jx,jy);
      fxy = IJ_Vptr(fval,jx,jy);

      /* Get species interaction rate array at (xx,yy) */
      WebRate(xx, yy, cxy, rxy, user_data);
      
      for(is = 0; is < NUM_SPECIES; is++) {
        
        /* Differencing in x direction */
        dcyli = *(cxy+is) - *(cxy - idyl + is) ;
        dcyui = *(cxy + idyu + is) - *(cxy+is);
        
        /* Differencing in y direction */
        dcxli = *(cxy+is) - *(cxy - idxl + is);
        dcxri = *(cxy + idxr +is) - *(cxy+is);
        
        /* Compute the total rate value at (xx,yy) */
        fxy[is] = (coy)[is] * (dcyui - dcyli) +
          (cox)[is] * (dcxri - dcxli) + rxy[is];
        
      } /* end of is loop */
      
    } /* end of jx loop */
    
  } /* end of jy loop */

  return(0);
}